

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O3

void __thiscall
vkt::pipeline::anon_unknown_0::SimpleGraphicsPipelineBuilder::bindShaderStage
          (SimpleGraphicsPipelineBuilder *this,VkShaderStageFlagBits stage,char *sourceName,
          char *entryName)

{
  uint uVar1;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *p_Var2;
  deUint32 *pdVar3;
  long lVar4;
  long lVar5;
  VkShaderModule obj;
  Handle<(vk::HandleType)14> HVar6;
  VkAllocationCallbacks *pVVar7;
  DeviceInterface *pDVar8;
  VkDevice pVVar9;
  const_iterator cVar10;
  deUint32 *pdVar11;
  Move<vk::Handle<(vk::HandleType)14>_> *pMVar12;
  VkShaderModuleCreateInfo moduleCreateInfo;
  undefined1 local_b0 [32];
  deUint32 *local_90;
  deUint64 local_88;
  DeviceInterface *pDStack_80;
  VkDevice local_78;
  VkAllocationCallbacks *pVStack_70;
  VkDevice local_60;
  Move<vk::Handle<(vk::HandleType)14>_> local_58;
  
  pDVar8 = Context::getDeviceInterface(this->m_context);
  pVVar9 = Context::getDevice(this->m_context);
  p_Var2 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)this->m_context->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b0,sourceName,(allocator<char> *)&local_88);
  local_60 = pVVar9;
  cVar10 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var2,(key_type *)local_b0);
  pdVar3 = *(deUint32 **)(*(long *)(cVar10._M_node + 2) + 8);
  pdVar11 = (deUint32 *)0x0;
  if (pdVar3 != *(deUint32 **)(*(long *)(cVar10._M_node + 2) + 0x10)) {
    pdVar11 = pdVar3;
  }
  if ((undefined1 *)CONCAT44(local_b0._4_4_,local_b0._0_4_) != local_b0 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_b0._4_4_,local_b0._0_4_),
                    CONCAT44(local_b0._20_4_,local_b0._16_4_) + 1);
  }
  p_Var2 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)this->m_context->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b0,sourceName,(allocator<char> *)&local_88);
  cVar10 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var2,(key_type *)local_b0);
  lVar4 = *(long *)(*(long *)(cVar10._M_node + 2) + 0x10);
  lVar5 = *(long *)(*(long *)(cVar10._M_node + 2) + 8);
  if ((undefined1 *)CONCAT44(local_b0._4_4_,local_b0._0_4_) != local_b0 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_b0._4_4_,local_b0._0_4_),
                    CONCAT44(local_b0._20_4_,local_b0._16_4_) + 1);
  }
  local_b0._0_4_ = VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO;
  local_b0._8_8_ = (void *)0x0;
  local_b0._16_4_ = 0;
  local_b0._24_8_ = lVar4 - lVar5 & 0xffffffff;
  local_90 = pdVar11;
  ::vk::createShaderModule
            (&local_58,pDVar8,local_60,(VkShaderModuleCreateInfo *)local_b0,
             (VkAllocationCallbacks *)0x0);
  pVVar7 = local_58.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator;
  pVVar9 = local_58.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device;
  pDVar8 = local_58.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_deviceIface;
  HVar6.m_internal =
       local_58.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal;
  local_78 = local_58.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device;
  pVStack_70 = local_58.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator;
  local_88 = local_58.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal;
  pDStack_80 = local_58.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_deviceIface;
  local_58.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal = 0;
  local_58.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_58.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_58.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  uVar1 = this->m_shaderStageCount;
  pMVar12 = this->m_shaderModules + uVar1;
  obj.m_internal =
       (pMVar12->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.object.m_internal;
  if (obj.m_internal == 0) {
    this->m_shaderModules[uVar1].super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
    m_device = pVVar9;
    this->m_shaderModules[uVar1].super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
    m_allocator = pVVar7;
    (pMVar12->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.object.m_internal =
         HVar6.m_internal;
    this->m_shaderModules[uVar1].super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
    m_deviceIface = pDVar8;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              (&this->m_shaderModules[uVar1].super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
                deleter,obj);
    this->m_shaderModules[uVar1].super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
    m_device = local_78;
    this->m_shaderModules[uVar1].super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
    m_allocator = pVStack_70;
    (pMVar12->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.object.m_internal = local_88;
    this->m_shaderModules[uVar1].super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
    m_deviceIface = pDStack_80;
    if (local_58.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
                (&local_58.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter,
                 (VkShaderModule)
                 local_58.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal);
    }
  }
  uVar1 = this->m_shaderStageCount;
  this->m_shaderStageInfo[uVar1].sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
  this->m_shaderStageInfo[uVar1].pNext = (void *)0x0;
  this->m_shaderStageInfo[uVar1].flags = 0;
  this->m_shaderStageInfo[uVar1].stage = stage;
  this->m_shaderStageInfo[uVar1].module.m_internal =
       this->m_shaderModules[uVar1].super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
       m_internal;
  this->m_shaderStageInfo[uVar1].pName = "main";
  this->m_shaderStageInfo[uVar1].pSpecializationInfo = (VkSpecializationInfo *)0x0;
  this->m_shaderStageCount = uVar1 + 1;
  return;
}

Assistant:

void SimpleGraphicsPipelineBuilder::bindShaderStage (VkShaderStageFlagBits stage,
													 const char*           sourceName,
													 const char*           entryName)
{
	const DeviceInterface&  vk        = m_context.getDeviceInterface();
	const VkDevice          vkDevice  = m_context.getDevice();

	// Create shader module
	deUint32*               code     = (deUint32*)m_context.getBinaryCollection().get(sourceName).getBinary();
	deUint32                codeSize  = (deUint32)m_context.getBinaryCollection().get(sourceName).getSize();

	const VkShaderModuleCreateInfo moduleCreateInfo =
	{
		VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO,                // VkStructureType             sType;
		DE_NULL,                                                    // const void*                 pNext;
		0u,                                                         // VkShaderModuleCreateFlags   flags;
		codeSize,                                                   // deUintptr                   codeSize;
		code,                                                       // const deUint32*             pCode;
	};

	m_shaderModules[m_shaderStageCount] = createShaderModule(vk, vkDevice, &moduleCreateInfo);

	// Prepare shader stage info
	m_shaderStageInfo[m_shaderStageCount].sType               = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
	m_shaderStageInfo[m_shaderStageCount].pNext               = DE_NULL;
	m_shaderStageInfo[m_shaderStageCount].flags               = 0u;
	m_shaderStageInfo[m_shaderStageCount].stage               = stage;
	m_shaderStageInfo[m_shaderStageCount].module              = *m_shaderModules[m_shaderStageCount];
	m_shaderStageInfo[m_shaderStageCount].pName               = entryName;
	m_shaderStageInfo[m_shaderStageCount].pSpecializationInfo = DE_NULL;

	m_shaderStageCount++;
}